

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnBrExpr(BinaryReaderInterp *this,Index depth)

{
  Result RVar1;
  Enum EVar2;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  Location loc_1;
  Location loc;
  Var local_78;
  
  RVar1 = GetBrDropKeepCount(this,depth,&drop_count,&keep_count);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = TypeChecker::GetCatchCount(&(this->validator_).typechecker_,depth,&catch_drop_count);
    if (RVar1.enum_ != Error) {
      loc.field_1.field_0.last_column = 0;
      loc.filename._M_len = (this->filename_)._M_len;
      loc.filename._M_str = (this->filename_)._M_str;
      loc_1.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      loc_1.field_1.field_0.last_column = 0;
      loc_1.filename._M_len = (this->filename_)._M_len;
      loc_1.filename._M_str = (this->filename_)._M_str;
      loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
      Var::Var(&local_78,depth,&loc_1);
      RVar1 = SharedValidator::OnBr(&this->validator_,&loc,&local_78);
      Var::~Var(&local_78);
      if (RVar1.enum_ != Error) {
        EmitBr(this,depth,drop_count,keep_count,catch_drop_count);
        EVar2 = Ok;
      }
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnBrExpr(Index depth) {
  Index drop_count, keep_count, catch_drop_count;
  CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
  CHECK_RESULT(validator_.GetCatchCount(depth, &catch_drop_count));
  CHECK_RESULT(validator_.OnBr(GetLocation(), Var(depth, GetLocation())));
  EmitBr(depth, drop_count, keep_count, catch_drop_count);
  return Result::Ok;
}